

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O3

Gia_Man_t * Gia_ManStgOneHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *p_01;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  Gia_Man_t *p_02;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint local_ac;
  uint local_a8;
  void *local_a0;
  uint local_94;
  void *local_88;
  int *local_50;
  
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0x143,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  p = Gia_ManStart(10000);
  pcVar5 = (char *)malloc(4);
  builtin_strncpy(pcVar5,"stg",4);
  p->pName = pcVar5;
  iVar12 = nStates + nIns;
  if (iVar12 != 0 && SCARRY4(nStates,nIns) == iVar12 < 0) {
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar18 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p->nObjs <= pGVar6)) {
LAB_00725c0e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar6 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar6)) goto LAB_00725c0e;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  Gia_ManHashAlloc(p);
  uVar14 = 1 << ((byte)nIns & 0x1f);
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar19 = 0x10;
  if (0x10 < uVar14) {
    uVar19 = uVar14;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar19;
  piVar7 = (int *)malloc((long)(int)uVar19 << 2);
  p_00->pArray = piVar7;
  if (nIns != 0x1f) {
    local_a8 = 1;
    if (1 < (int)uVar14) {
      local_a8 = uVar14;
    }
    uVar19 = 0;
    do {
      if (nIns < 1) {
        iVar12 = 1;
      }
      else {
        iVar12 = 1;
        iVar17 = 2;
        uVar11 = 0;
        do {
          uVar13 = uVar11 + 1;
          iVar12 = Gia_ManHashAnd(p,iVar12,iVar17 + (uint)((~uVar19 >> (uVar11 & 0x1f) & 1) != 0));
          iVar17 = iVar17 + 2;
          uVar11 = uVar13;
        } while (nIns != uVar13);
      }
      Vec_IntPush(p_00,iVar12);
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_a8);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < nStates - 1U) {
    iVar12 = nStates;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar12;
  if (iVar12 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar12 << 2);
  }
  p_01->pArray = piVar7;
  if (0 < nStates) {
    iVar12 = nIns * 2;
    iVar17 = 0;
    do {
      iVar12 = iVar12 + 2;
      if (nIns + 1 + iVar17 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_01,iVar12 + (uint)(iVar17 == 0));
      iVar17 = iVar17 + 1;
    } while (nStates != iVar17);
  }
  local_94 = 8;
  if (6 < nStates - 1U) {
    local_94 = nStates;
  }
  if (local_94 == 0) {
    local_a0 = (void *)0x0;
  }
  else {
    local_a0 = malloc((long)(int)local_94 << 3);
  }
  if (0 < nStates) {
    uVar18 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      *(void **)((long)local_a0 + uVar18 * 8) = pvVar8;
      uVar18 = uVar18 + 1;
    } while ((uint)nStates != uVar18);
  }
  piVar7 = (int *)malloc(0x10);
  iVar12 = 8;
  if (6 < nOuts - 1U) {
    iVar12 = nOuts;
  }
  *piVar7 = iVar12;
  if (iVar12 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)iVar12 << 3);
  }
  *(void **)(piVar7 + 2) = pvVar8;
  if (0 < nOuts) {
    uVar18 = 0;
    do {
      pvVar9 = calloc(1,0x10);
      *(void **)((long)pvVar8 + uVar18 * 8) = pvVar9;
      uVar18 = uVar18 + 1;
    } while ((uint)nOuts != uVar18);
  }
  piVar7[1] = nOuts;
  uVar19 = vLines->nSize;
  local_ac = nStates;
  if ((int)uVar19 < 1) {
    local_50 = p_00->pArray;
    local_88 = local_a0;
  }
  else {
    uVar18 = 0;
    local_88 = local_a0;
    do {
      if ((long)(int)uVar19 <= (long)(uVar18 | 1)) {
LAB_00725bef:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (((ulong)uVar19 <= (uVar18 | 2)) || ((ulong)uVar19 <= (uVar18 | 3))) goto LAB_00725bef;
      piVar4 = vLines->pArray;
      uVar19 = piVar4[uVar18];
      if (((int)uVar19 < 0) || ((int)uVar14 <= (int)uVar19)) {
        __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x163,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      uVar11 = piVar4[uVar18 | 1];
      if (((int)uVar11 < 1) || (nStates < (int)uVar11)) {
        __assert_fail("iCur >= 0 && iCur < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x164,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      uVar13 = piVar4[uVar18 | 2];
      if (((int)uVar13 < 1) || (nStates < (int)uVar13)) {
        __assert_fail("iNext >= 0 && iNext < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x165,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      uVar2 = piVar4[uVar18 | 3];
      if (((int)uVar2 < 0) || (1 << ((byte)nOuts & 0x1f) <= (int)uVar2)) {
        __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x166,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      if ((p_00->nSize <= (int)uVar19) || (p_01->nSize < (int)uVar11)) goto LAB_00725bef;
      local_50 = p_00->pArray;
      iVar12 = Gia_ManHashAnd(p,local_50[uVar19],p_01->pArray[(ulong)uVar11 - 1]);
      iVar17 = uVar13 - local_ac;
      if ((int)local_ac < (int)uVar13) {
        if ((int)local_94 < (int)uVar13) {
          local_94 = uVar13;
          if (local_88 == (void *)0x0) {
            local_88 = malloc((ulong)uVar13 * 8);
          }
          else {
            local_88 = realloc(local_88,(ulong)uVar13 * 8);
          }
        }
        lVar10 = (long)(int)local_ac;
        lVar16 = 0;
        do {
          pvVar9 = calloc(1,0x10);
          *(void **)((long)local_a0 + lVar16 * 8 + lVar10 * 8) = pvVar9;
          lVar16 = lVar16 + 1;
          local_ac = uVar13;
        } while (iVar17 != (int)lVar16);
      }
      else if (local_ac < uVar13) {
LAB_00725bd0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      Vec_IntPush(*(Vec_Int_t **)((long)local_a0 + (ulong)(uVar13 - 1) * 8),iVar12);
      if (0 < nOuts) {
        uVar15 = 0;
        do {
          if ((uVar2 >> ((uint)uVar15 & 0x1f) & 1) != 0) {
            uVar20 = (ulong)piVar7[1];
            uVar1 = uVar15 + 1;
            if ((long)uVar20 <= (long)uVar15) {
              iVar17 = (int)uVar1;
              if ((long)*piVar7 <= (long)uVar15) {
                if (*(void **)(piVar7 + 2) == (void *)0x0) {
                  pvVar9 = malloc(uVar1 * 8);
                }
                else {
                  pvVar9 = realloc(*(void **)(piVar7 + 2),uVar1 * 8);
                }
                *(void **)(piVar7 + 2) = pvVar9;
                *piVar7 = iVar17;
              }
              do {
                uVar20 = uVar20 + 1;
                pvVar9 = calloc(1,0x10);
                *(void **)((long)pvVar8 + uVar20 * 8 + -8) = pvVar9;
              } while (uVar1 != (uVar20 & 0xffffffff));
              piVar7[1] = iVar17;
              uVar20 = (ulong)iVar17;
            }
            if ((long)uVar20 <= (long)uVar15) goto LAB_00725bd0;
            Vec_IntPush(*(Vec_Int_t **)((long)pvVar8 + uVar15 * 8),iVar12);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uint)nOuts);
      }
      uVar18 = uVar18 + 4;
      uVar19 = vLines->nSize;
    } while ((int)uVar18 < (int)uVar19);
  }
  if (local_50 != (int *)0x0) {
    free(local_50);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  iVar12 = piVar7[1];
  lVar10 = (long)iVar12;
  pvVar8 = *(void **)(piVar7 + 2);
  if (lVar10 < 1) {
    if (pvVar8 != (void *)0x0) goto LAB_00725aea;
  }
  else {
    lVar16 = 0;
    do {
      iVar17 = Gia_ManCreateOrGate(p,*(Vec_Int_t **)((long)pvVar8 + lVar16 * 8));
      Gia_ManAppendCo(p,iVar17);
      lVar16 = lVar16 + 1;
    } while (lVar10 != lVar16);
    if (0 < iVar12) {
      lVar16 = 0;
      do {
        pvVar9 = *(void **)((long)pvVar8 + lVar16 * 8);
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        lVar16 = lVar16 + 1;
      } while (lVar10 != lVar16);
    }
LAB_00725aea:
    free(pvVar8);
  }
  free(piVar7);
  if ((int)local_ac < 1) {
    if (local_88 == (void *)0x0) goto LAB_00725b85;
  }
  else {
    uVar18 = 0;
    do {
      uVar19 = Gia_ManCreateOrGate(p,*(Vec_Int_t **)((long)local_88 + uVar18 * 8));
      if ((int)uVar19 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar19 ^ uVar18 == 0);
      uVar18 = uVar18 + 1;
    } while (local_ac != uVar18);
    if (0 < (int)local_ac) {
      uVar18 = 0;
      do {
        pvVar8 = *(void **)((long)local_88 + uVar18 * 8);
        if (pvVar8 != (void *)0x0) {
          if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar8 + 8));
          }
          free(pvVar8);
        }
        uVar18 = uVar18 + 1;
      } while (local_ac != uVar18);
    }
  }
  free(local_88);
LAB_00725b85:
  Gia_ManSetRegNum(p,nStates);
  Gia_ManHashStop(p);
  p_02 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  iVar12 = Gia_ManHasDangling(p_02);
  if (iVar12 != 0) {
    __assert_fail("!Gia_ManHasDangling(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0x188,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  return p_02;
}

Assistant:

Gia_Man_t * Gia_ManStgOneHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts;
    int i, b, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nStates; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    for ( i = 0; i < nStates; i++ )
        Vec_IntPush( vCurs, Abc_Var2Lit( 1+nIns+i, !i ) );

    // go through the lines
    vLitsNext = Vec_VecStart( nStates );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++) - 1;
        int iNext = Vec_IntEntry(vLines, i++) - 1;
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vNexts, iNext) );
//        Vec_IntWriteEntry( vNexts, iNext, Lit );
        Vec_VecPushInt( vLitsNext, iNext, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
            {
//                Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vOuts, b) );
//                Vec_IntWriteEntry( vOuts, b, Lit );
                Vec_VecPushInt( vLitsOuts, b, LitC );
            }
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, i )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, i )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), !i ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nStates );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}